

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O0

Instr * __thiscall
LowererMD::Simd128CanonicalizeToBools(LowererMD *this,Instr *instr,OpCode *cmpOpcode,Opnd *dstOpnd)

{
  OpCode opcode;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ThreadContextInfo *pTVar4;
  intptr_t iVar5;
  MemRefOpnd *pMVar6;
  Instr *pIVar7;
  Instr *pInstr;
  Opnd *dstOpnd_local;
  OpCode *cmpOpcode_local;
  Instr *instr_local;
  LowererMD *this_local;
  
  if (((((instr->m_opcode != Simd128_IntsToB4) && (instr->m_opcode != Simd128_IntsToB8)) &&
       (instr->m_opcode != Simd128_IntsToB16)) &&
      ((((instr->m_opcode != Simd128_ReplaceLane_B4 && (instr->m_opcode != Simd128_ReplaceLane_B8))
        && ((instr->m_opcode != Simd128_ReplaceLane_B16 &&
            ((instr->m_opcode != Simd128_AnyTrue_B2 && (instr->m_opcode != Simd128_AnyTrue_B4))))))
       && (instr->m_opcode != Simd128_AnyTrue_B8)))) &&
     ((((instr->m_opcode != Simd128_AnyTrue_B16 && (instr->m_opcode != Simd128_AllTrue_B2)) &&
       (instr->m_opcode != Simd128_AllTrue_B4)) &&
      ((instr->m_opcode != Simd128_AllTrue_B8 && (instr->m_opcode != Simd128_AllTrue_B16)))))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x1d4,
                       "(instr->m_opcode == Js::OpCode::Simd128_IntsToB4 || instr->m_opcode == Js::OpCode::Simd128_IntsToB8 || instr->m_opcode == Js::OpCode::Simd128_IntsToB16 || instr->m_opcode == Js::OpCode::Simd128_ReplaceLane_B4 || instr->m_opcode == Js::OpCode::Simd128_ReplaceLane_B8 || instr->m_opcode == Js::OpCode::Simd128_ReplaceLane_B16 || instr->m_opcode == Js::OpCode::Simd128_AnyTrue_B2 || instr->m_opcode == Js::OpCode::Simd128_AnyTrue_B4 || instr->m_opcode == Js::OpCode::Simd128_AnyTrue_B8 || instr->m_opcode == Js::OpCode::Simd128_AnyTrue_B16 || instr->m_opcode == Js::OpCode::Simd128_AllTrue_B2 || instr->m_opcode == Js::OpCode::Simd128_AllTrue_B4 || instr->m_opcode == Js::OpCode::Simd128_AllTrue_B8 || instr->m_opcode == Js::OpCode::Simd128_AllTrue_B16)"
                       ,
                       "instr->m_opcode == Js::OpCode::Simd128_IntsToB4 || instr->m_opcode == Js::OpCode::Simd128_IntsToB8 || instr->m_opcode == Js::OpCode::Simd128_IntsToB16 || instr->m_opcode == Js::OpCode::Simd128_ReplaceLane_B4 || instr->m_opcode == Js::OpCode::Simd128_ReplaceLane_B8 || instr->m_opcode == Js::OpCode::Simd128_ReplaceLane_B16 || instr->m_opcode == Js::OpCode::Simd128_AnyTrue_B2 || instr->m_opcode == Js::OpCode::Simd128_AnyTrue_B4 || instr->m_opcode == Js::OpCode::Simd128_AnyTrue_B8 || instr->m_opcode == Js::OpCode::Simd128_AnyTrue_B16 || instr->m_opcode == Js::OpCode::Simd128_AllTrue_B2 || instr->m_opcode == Js::OpCode::Simd128_AllTrue_B4 || instr->m_opcode == Js::OpCode::Simd128_AllTrue_B8 || instr->m_opcode == Js::OpCode::Simd128_AllTrue_B16"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  opcode = *cmpOpcode;
  pTVar4 = Func::GetThreadContextInfo(this->m_func);
  iVar5 = ThreadContextInfo::GetX86AllZerosAddr(pTVar4);
  pMVar6 = IR::MemRefOpnd::New(iVar5,TySimd128I4,this->m_func,AddrOpndKindDynamicMisc);
  pIVar7 = IR::Instr::New(opcode,dstOpnd,dstOpnd,&pMVar6->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instr,pIVar7);
  Legalize<false>(pIVar7,false);
  pTVar4 = Func::GetThreadContextInfo(this->m_func);
  iVar5 = ThreadContextInfo::GetX86AllNegOnesAddr(pTVar4);
  pMVar6 = IR::MemRefOpnd::New(iVar5,TySimd128I4,this->m_func,AddrOpndKindDynamicMisc);
  pIVar7 = IR::Instr::New(PANDN,dstOpnd,dstOpnd,&pMVar6->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instr,pIVar7);
  Legalize<false>(pIVar7,false);
  return instr;
}

Assistant:

IR::Instr* LowererMD::Simd128CanonicalizeToBools(IR::Instr* instr, const Js::OpCode &cmpOpcode, IR::Opnd& dstOpnd)
{
    Assert(instr->m_opcode == Js::OpCode::Simd128_IntsToB4 || instr->m_opcode == Js::OpCode::Simd128_IntsToB8 || instr->m_opcode == Js::OpCode::Simd128_IntsToB16 ||
           instr->m_opcode == Js::OpCode::Simd128_ReplaceLane_B4 || instr->m_opcode == Js::OpCode::Simd128_ReplaceLane_B8 || instr->m_opcode == Js::OpCode::Simd128_ReplaceLane_B16 ||
           instr->m_opcode == Js::OpCode::Simd128_AnyTrue_B2 || instr->m_opcode == Js::OpCode::Simd128_AnyTrue_B4 || instr->m_opcode == Js::OpCode::Simd128_AnyTrue_B8 || instr->m_opcode == Js::OpCode::Simd128_AnyTrue_B16 ||
           instr->m_opcode == Js::OpCode::Simd128_AllTrue_B2 || instr->m_opcode == Js::OpCode::Simd128_AllTrue_B4 || instr->m_opcode == Js::OpCode::Simd128_AllTrue_B8 || instr->m_opcode == Js::OpCode::Simd128_AllTrue_B16
    );
    IR::Instr *pInstr;
    //dst = cmpOpcode dst, X86_ALL_ZEROS
    pInstr = IR::Instr::New(cmpOpcode, &dstOpnd, &dstOpnd, IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86AllZerosAddr(), TySimd128I4, m_func), m_func);
    instr->InsertBefore(pInstr);
    Legalize(pInstr);
    // dst = PANDN dst, X86_ALL_NEG_ONES
    pInstr = IR::Instr::New(Js::OpCode::PANDN, &dstOpnd, &dstOpnd, IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86AllNegOnesAddr(), TySimd128I4, m_func), m_func);
    instr->InsertBefore(pInstr);
    Legalize(pInstr);
    return instr;
}